

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ArrayStrideValidator::validateSingleVariable
          (ArrayStrideValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  string *this_00;
  bool bVar1;
  DataType DVar2;
  int iVar3;
  size_type sVar4;
  InterfaceBlock *pIVar5;
  VarType *pVVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  byte local_725;
  int local_724;
  bool local_6da;
  bool local_6d9;
  const_reference local_6d0;
  allocator<char> local_6b9;
  string local_6b8;
  MessageBuilder local_698;
  MessageBuilder local_518;
  int local_398;
  allocator<char> local_391;
  int arrayStride;
  MessageBuilder local_370;
  MessageBuilder local_1e0;
  int local_60;
  undefined1 local_5b;
  bool local_5a;
  bool local_59;
  int elementSize;
  bool isAtomicCounter;
  bool isArray;
  bool isBufferBlock;
  VariablePathComponent *firstComponent;
  VariablePathComponent *enclosingcomponent;
  VariablePathComponent *component;
  VariablePathComponent nullComponent;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  ArrayStrideValidator *this_local;
  
  nullComponent._8_8_ = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  ProgramInterfaceDefinition::VariablePathComponent::VariablePathComponent
            ((VariablePathComponent *)&component);
  enclosingcomponent =
       std::
       vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
       ::back((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               *)resource_local);
  sVar4 = std::
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          ::size((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                  *)resource_local);
  this_00 = resource_local;
  if (sVar4 < 2) {
    local_6d0 = (const_reference)&component;
  }
  else {
    sVar4 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            ::size((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                    *)resource_local);
    local_6d0 = std::
                vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                ::operator[]((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                              *)this_00,sVar4 - 2);
  }
  firstComponent = local_6d0;
  _elementSize = std::
                 vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                          *)resource_local);
  bVar1 = ProgramInterfaceDefinition::VariablePathComponent::isInterfaceBlock(_elementSize);
  local_6d9 = false;
  if (bVar1) {
    pIVar5 = ProgramInterfaceDefinition::VariablePathComponent::getInterfaceBlock(_elementSize);
    local_6d9 = isBufferBackedInterfaceBlockStorage(pIVar5->storage);
  }
  local_59 = local_6d9;
  bVar1 = ProgramInterfaceDefinition::VariablePathComponent::isVariableType(firstComponent);
  local_6da = false;
  if (bVar1) {
    pVVar6 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(firstComponent);
    local_6da = glu::VarType::isArrayType(pVVar6);
  }
  local_5a = local_6da;
  pVVar6 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(enclosingcomponent);
  DVar2 = glu::VarType::getBasicType(pVVar6);
  local_5b = glu::isDataTypeAtomicCounter(DVar2);
  if (((local_59 & 1U) == 0) || ((local_5a & 1U) == 0)) {
    if (((bool)local_5b) && ((local_5a & 1U) != 0)) {
      local_724 = 4;
    }
    else {
      local_725 = 0;
      if ((local_59 & 1U) == 0) {
        local_725 = local_5b ^ 0xff;
      }
      local_724 = 0;
      if ((local_725 & 1) != 0) {
        local_724 = -1;
      }
    }
    local_398 = local_724;
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_518,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_518,(char (*) [35])"Verifying array stride, expecting ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_398);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_518);
    if (local_398 != implementationName_local._4_4_) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_698,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<(&local_698,(char (*) [13])"\tError, got ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_698);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6b8,"resource array stride invalid",&local_6b9);
      PropValidator::setError((PropValidator *)this,&local_6b8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::allocator<char>::~allocator(&local_6b9);
    }
  }
  else {
    pVVar6 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(enclosingcomponent);
    DVar2 = glu::VarType::getBasicType(pVVar6);
    iVar3 = glu::getDataTypeScalarSize(DVar2);
    pVVar6 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(enclosingcomponent);
    DVar2 = glu::VarType::getBasicType(pVVar6);
    DVar2 = glu::getDataTypeScalarType(DVar2);
    local_60 = getTypeSize(DVar2);
    local_60 = iVar3 * local_60;
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_1e0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_1e0,
                        (char (*) [55])"Verifying array stride, expecting greater or equal to ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_60);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    if (implementationName_local._4_4_ < local_60) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_370,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<(&local_370,(char (*) [13])"\tError, got ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_370);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arrayStride,"resource array stride invalid",&local_391);
      PropValidator::setError((PropValidator *)this,(string *)&arrayStride);
      std::__cxx11::string::~string((string *)&arrayStride);
      std::allocator<char>::~allocator(&local_391);
    }
  }
  return;
}

Assistant:

void ArrayStrideValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const VariablePathComponent		nullComponent;
	const VariablePathComponent&	component			= path.back();
	const VariablePathComponent&	enclosingcomponent	= (path.size() > 1) ? (path[path.size()-2]) : (nullComponent);
	const VariablePathComponent&	firstComponent		= path.front();

	const bool						isBufferBlock		= firstComponent.isInterfaceBlock() && isBufferBackedInterfaceBlockStorage(firstComponent.getInterfaceBlock()->storage);
	const bool						isArray				= enclosingcomponent.isVariableType() && enclosingcomponent.getVariableType()->isArrayType();
	const bool						isAtomicCounter		= glu::isDataTypeAtomicCounter(component.getVariableType()->getBasicType()); // atomic counters are buffer backed with a stride of 4 basic machine units

	DE_UNREF(resource);
	DE_UNREF(implementationName);

	// Layout tests will verify layouts of buffer backed arrays properly. Here we just check values are greater or equal to the element size
	if (isBufferBlock && isArray)
	{
		const int elementSize = glu::getDataTypeScalarSize(component.getVariableType()->getBasicType()) * getTypeSize(glu::getDataTypeScalarType(component.getVariableType()->getBasicType()));
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying array stride, expecting greater or equal to " << elementSize << tcu::TestLog::EndMessage;

		if (propValue < elementSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource array stride invalid");
		}
	}
	else
	{
		// Atomics are buffer backed with stride of 4 even though they are not in an interface block
		const int arrayStride = (isAtomicCounter && isArray) ? (4) : (!isBufferBlock && !isAtomicCounter) ? (-1) : (0);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying array stride, expecting " << arrayStride << tcu::TestLog::EndMessage;

		if (arrayStride != propValue)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource array stride invalid");
		}
	}
}